

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

void __thiscall
arangodb::velocypack::Buffer<unsigned_char>::Buffer
          (Buffer<unsigned_char> *this,Buffer<unsigned_char> *that)

{
  ulong __size;
  uchar *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  
  this->_buffer = this->_local;
  this->_capacity = 0xc0;
  this->_size = 0;
  this->_local[0] = '\0';
  __size = that->_size;
  if (__size != 0) {
    uVar3 = 0xc0;
    if (0xc0 < __size) {
      puVar1 = (uchar *)malloc(__size);
      this->_buffer = puVar1;
      uVar3 = __size;
      if (puVar1 == (uchar *)0x0) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = std::ios::widen;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    this->_capacity = uVar3;
    memcpy(this->_buffer,that->_buffer,__size);
    this->_size = that->_size;
  }
  return;
}

Assistant:

Buffer() noexcept : _buffer(_local), _capacity(sizeof(_local)), _size(0) {
    poison(_buffer, _capacity);
    initWithNone();
  }